

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboColorbufferTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::FboColorTex3DCase::render(FboColorTex3DCase *this,Surface *dst)

{
  ulong uVar1;
  deUint32 dVar2;
  DataType DVar3;
  deUint32 program;
  deUint32 program_00;
  int iVar4;
  int iVar5;
  int depth;
  char *str;
  DataTypes *samplerTypes;
  Context *pCVar6;
  TransferFormat TVar7;
  undefined1 *this_00;
  int *piVar8;
  size_type sVar9;
  deUint32 *pdVar10;
  reference pvVar11;
  void *data_00;
  ContextWrapper *this_01;
  float fVar12;
  Vector<float,_3> local_55c;
  undefined1 local_550 [8];
  Vec3 p1;
  Vec3 p0;
  Vector<float,_3> local_52c;
  PixelBufferAccess local_520;
  Vector<float,_4> local_4f8;
  Vec4 local_4e8;
  PixelBufferAccess local_4d8;
  TextureFormat local_4b0;
  undefined1 local_4a8 [8];
  TextureLevel data;
  IVec3 *viewport;
  deUint32 local_470;
  deUint32 fbo;
  deUint32 tmpTex;
  int texH;
  int texW;
  deUint32 dataType;
  deUint32 format;
  int layer;
  size_t ndx_1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_448;
  value_type_conflict1 local_43c;
  ulong local_438;
  size_t n;
  vector<int,_std::allocator<int>_> order;
  deUint32 layerFbo;
  int ndx;
  IVec3 *size;
  deUint32 local_3fc;
  deUint32 dStack_3f8;
  TransferFormat transferFmt;
  deUint32 tex;
  vector<unsigned_int,_std::allocator<unsigned_int>_> fbos;
  deUint32 tdTexShaderID;
  deUint32 texToFboShaderID;
  undefined1 local_3c8 [8];
  Texture3DShader tdTexShader;
  DataTypes local_238;
  undefined1 local_218 [8];
  Texture2DShader texToFboShader;
  TextureFormatInfo fmtInfo;
  TextureFormat local_30;
  TextureFormat texFmt;
  Random rnd;
  Surface *dst_local;
  FboColorTex3DCase *this_local;
  
  str = tcu::TestNode::getName((TestNode *)this);
  dVar2 = deStringHash(str);
  de::Random::Random((Random *)&texFmt,dVar2 ^ 0x74d947b2);
  local_30 = glu::mapGLInternalFormat((this->super_FboColorbufferCase).m_format);
  tcu::getTextureFormatInfo((TextureFormatInfo *)&texToFboShader.field_0x194,&local_30);
  local_238.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FboTestUtil::DataTypes::DataTypes(&local_238);
  samplerTypes = FboTestUtil::DataTypes::operator<<(&local_238,TYPE_SAMPLER_2D);
  DVar3 = FboTestUtil::getFragmentOutputType(&local_30);
  tcu::operator-((tcu *)&tdTexShader.m_outputType,(Vector<float,_4> *)(fmtInfo.valueMin.m_data + 2),
                 (Vector<float,_4> *)&texToFboShader.field_0x194);
  FboTestUtil::Texture2DShader::Texture2DShader
            ((Texture2DShader *)local_218,samplerTypes,DVar3,(Vec4 *)&tdTexShader.m_outputType,
             (Vec4 *)&texToFboShader.field_0x194);
  FboTestUtil::DataTypes::~DataTypes(&local_238);
  DVar3 = glu::getSampler3DType(local_30);
  FboTestUtil::Texture3DShader::Texture3DShader((Texture3DShader *)local_3c8,DVar3,TYPE_FLOAT_VEC4);
  pCVar6 = sglr::ContextWrapper::getCurrentContext
                     (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
  program = (*pCVar6->_vptr_Context[0x75])(pCVar6,local_218);
  pCVar6 = sglr::ContextWrapper::getCurrentContext
                     (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
  program_00 = (*pCVar6->_vptr_Context[0x75])(pCVar6,local_3c8);
  pCVar6 = sglr::ContextWrapper::getCurrentContext
                     (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
  FboTestUtil::Texture2DShader::setUniforms((Texture2DShader *)local_218,pCVar6,program);
  FboTestUtil::Texture3DShader::setTexScaleBias
            ((Texture3DShader *)local_3c8,(Vec4 *)(fmtInfo.valueMax.m_data + 2),
             (Vec4 *)(fmtInfo.lookupScale.m_data + 2));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&transferFmt.dataType);
  TVar7 = glu::getTransferFormat(local_30);
  this_00 = &(this->super_FboColorbufferCase).field_0x8c;
  sglr::ContextWrapper::glGenTextures
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,1,
             &transferFmt.format);
  sglr::ContextWrapper::glBindTexture
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x806f,
             transferFmt.format);
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x806f,0x2802,
             0x812f);
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x806f,0x2803,
             0x812f);
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x806f,0x8072,
             0x812f);
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x806f,0x2801,
             0x2600);
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x806f,0x2800,
             0x2600);
  dVar2 = (this->super_FboColorbufferCase).m_format;
  iVar4 = tcu::Vector<int,_3>::x((Vector<int,_3> *)this_00);
  iVar5 = tcu::Vector<int,_3>::y((Vector<int,_3> *)this_00);
  depth = tcu::Vector<int,_3>::z((Vector<int,_3> *)this_00);
  local_3fc = TVar7.format;
  dStack_3f8 = TVar7.dataType;
  sglr::ContextWrapper::glTexImage3D
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x806f,0,dVar2
             ,iVar4,iVar5,depth,0,local_3fc,dStack_3f8,(void *)0x0);
  order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  while( true ) {
    iVar4 = order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_4_;
    piVar8 = tcu::Vector<int,_3>::z((Vector<int,_3> *)&(this->super_FboColorbufferCase).field_0x8c);
    if (*piVar8 <= iVar4) break;
    sglr::ContextWrapper::glGenFramebuffers
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,1,
               (deUint32 *)
               &order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
    sglr::ContextWrapper::glBindFramebuffer
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8d40,
               (deUint32)
               order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage);
    sglr::ContextWrapper::glFramebufferTextureLayer
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8d40,
               0x8ce0,transferFmt.format,0,
               order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage._4_4_);
    FboTestCase::checkError((FboTestCase *)this);
    FboTestCase::checkFramebufferStatus((FboTestCase *)this,0x8d40);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&transferFmt.dataType,
               (value_type_conflict4 *)
               &order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
    order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ =
         order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_ + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&n);
  local_438 = 0;
  while( true ) {
    uVar1 = local_438;
    sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&transferFmt.dataType)
    ;
    if (sVar9 <= uVar1) break;
    local_43c = (value_type_conflict1)local_438;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&n,&local_43c);
    local_438 = local_438 + 1;
  }
  local_448._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin((vector<int,_std::allocator<int>_> *)&n)
  ;
  ndx_1 = (size_t)std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)&n);
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((Random *)&texFmt,local_448,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)ndx_1);
  _format = 0;
  while( true ) {
    uVar1 = _format;
    sVar9 = std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)&n);
    if (sVar9 <= uVar1) break;
    pdVar10 = (deUint32 *)
              std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)&n,_format);
    dataType = *pdVar10;
    texW = 0x1908;
    texH = 0x1401;
    tmpTex = 0x80;
    fbo = 0x80;
    local_470 = 0;
    pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &transferFmt.dataType,(long)(int)dataType);
    dVar2 = *pvVar11;
    data.m_data.m_cap = (size_t)&(this->super_FboColorbufferCase).field_0x8c;
    local_4b0 = glu::mapGLTransferFormat(0x1908,0x1401);
    tcu::TextureLevel::TextureLevel((TextureLevel *)local_4a8,&local_4b0,0x80,0x80,1);
    tcu::TextureLevel::getAccess(&local_4d8,(TextureLevel *)local_4a8);
    generateRandomColor((Functional *)&local_4e8,(Random *)&texFmt);
    tcu::Vector<float,_4>::Vector(&local_4f8,0.0);
    tcu::fillWithGrid(&local_4d8,8,&local_4e8,&local_4f8);
    sglr::ContextWrapper::glGenTextures
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,1,&local_470
              );
    sglr::ContextWrapper::glBindTexture
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,
               local_470);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0x2802
               ,0x812f);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0x2803
               ,0x812f);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0x2801
               ,0x2601);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0x2800
               ,0x2601);
    tcu::TextureLevel::getAccess(&local_520,(TextureLevel *)local_4a8);
    data_00 = tcu::PixelBufferAccess::getDataPtr(&local_520);
    sglr::ContextWrapper::glTexImage2D
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0,
               0x1908,0x80,0x80,0,0x1908,0x1401,data_00);
    sglr::ContextWrapper::glBindFramebuffer
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8d40,dVar2
              );
    iVar4 = tcu::Vector<int,_3>::x((Vector<int,_3> *)data.m_data.m_cap);
    iVar5 = tcu::Vector<int,_3>::y((Vector<int,_3> *)data.m_data.m_cap);
    sglr::ContextWrapper::glViewport
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0,0,iVar4,
               iVar5);
    pCVar6 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
    tcu::Vector<float,_3>::Vector(&local_52c,-1.0,-1.0,0.0);
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(p0.m_data + 1),1.0,1.0,0.0);
    sglr::drawQuad(pCVar6,program,&local_52c,(Vec3 *)(p0.m_data + 1));
    FboTestCase::checkError((FboTestCase *)this);
    tcu::Vector<float,_3>::Vector
              ((Vector<float,_3> *)(p1.m_data + 1),(float)((uint)_format & 1) - 1.0,
               (float)(_format >> 1) - 1.0,0.0);
    tcu::Vector<float,_3>::Vector(&local_55c,1.0,1.0,0.0);
    tcu::operator+((tcu *)local_550,(Vector<float,_3> *)(p1.m_data + 1),&local_55c);
    sglr::ContextWrapper::glBindFramebuffer
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8d40,0);
    this_01 = &(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper;
    iVar4 = sglr::ContextWrapper::getWidth(this_01);
    iVar5 = sglr::ContextWrapper::getHeight
                      (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
    sglr::ContextWrapper::glViewport(this_01,0,0,iVar4,iVar5);
    sglr::ContextWrapper::glActiveTexture
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x84c0);
    sglr::ContextWrapper::glBindTexture
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x806f,
               transferFmt.format);
    fVar12 = (float)(int)dataType;
    piVar8 = tcu::Vector<int,_3>::z((Vector<int,_3> *)&(this->super_FboColorbufferCase).field_0x8c);
    FboTestUtil::Texture3DShader::setDepth
              ((Texture3DShader *)local_3c8,fVar12 / (float)(*piVar8 + -1));
    pCVar6 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
    FboTestUtil::Texture3DShader::setUniforms((Texture3DShader *)local_3c8,pCVar6,program_00);
    pCVar6 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
    sglr::drawQuad(pCVar6,program_00,(Vec3 *)(p1.m_data + 1),(Vec3 *)local_550);
    FboTestCase::checkError((FboTestCase *)this);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_4a8);
    _format = _format + 1;
  }
  iVar4 = sglr::ContextWrapper::getWidth
                    (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
  iVar5 = sglr::ContextWrapper::getHeight
                    (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
  FboTestCase::readPixels((FboTestCase *)this,dst,0,0,iVar4,iVar5);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&n);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&transferFmt.dataType);
  FboTestUtil::Texture3DShader::~Texture3DShader((Texture3DShader *)local_3c8);
  FboTestUtil::Texture2DShader::~Texture2DShader((Texture2DShader *)local_218);
  de::Random::~Random((Random *)&texFmt);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		de::Random				rnd				(deStringHash(getName()) ^ 0x74d947b2);
		tcu::TextureFormat		texFmt			= glu::mapGLInternalFormat(m_format);
		tcu::TextureFormatInfo	fmtInfo			= tcu::getTextureFormatInfo(texFmt);

		Texture2DShader			texToFboShader	(DataTypes() << glu::TYPE_SAMPLER_2D, getFragmentOutputType(texFmt), fmtInfo.valueMax-fmtInfo.valueMin, fmtInfo.valueMin);
		Texture3DShader			tdTexShader		(glu::getSampler3DType(texFmt), glu::TYPE_FLOAT_VEC4);

		deUint32				texToFboShaderID= getCurrentContext()->createProgram(&texToFboShader);
		deUint32				tdTexShaderID	= getCurrentContext()->createProgram(&tdTexShader);

		// Setup shaders
		texToFboShader.setUniforms(*getCurrentContext(), texToFboShaderID);
		tdTexShader.setTexScaleBias(fmtInfo.lookupScale, fmtInfo.lookupBias);

		// Framebuffers.
		std::vector<deUint32>	fbos;
		deUint32				tex;

		{
			glu::TransferFormat		transferFmt		= glu::getTransferFormat(texFmt);
			const IVec3&			size			= m_texSize;

			glGenTextures(1, &tex);

			glBindTexture(GL_TEXTURE_3D,		tex);
			glTexParameteri(GL_TEXTURE_3D,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_3D,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_3D,	GL_TEXTURE_WRAP_R,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_3D,	GL_TEXTURE_MIN_FILTER,	GL_NEAREST);
			glTexParameteri(GL_TEXTURE_3D,	GL_TEXTURE_MAG_FILTER,	GL_NEAREST);
			glTexImage3D(GL_TEXTURE_3D, 0, m_format, size.x(), size.y(), size.z(), 0, transferFmt.format, transferFmt.dataType, DE_NULL);

			// Generate an FBO for each layer
			for (int ndx = 0; ndx < m_texSize.z(); ndx++)
			{
				deUint32			layerFbo;

				glGenFramebuffers(1, &layerFbo);
				glBindFramebuffer(GL_FRAMEBUFFER, layerFbo);
				glFramebufferTextureLayer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, tex, 0, ndx);
				checkError();
				checkFramebufferStatus(GL_FRAMEBUFFER);

				fbos.push_back(layerFbo);
			}
		}

		// Render test images to random texture layers
		std::vector<int> order;

		for (size_t n = 0; n < fbos.size(); n++)
			order.push_back((int)n);
		rnd.shuffle(order.begin(), order.end());

		for (size_t ndx = 0; ndx < order.size(); ndx++)
		{
			const int			layer		= order[ndx];
			const deUint32		format		= GL_RGBA;
			const deUint32		dataType	= GL_UNSIGNED_BYTE;
			const int			texW		= 128;
			const int			texH		= 128;
			deUint32			tmpTex		= 0;
			const deUint32		fbo			= fbos[layer];
			const IVec3&		viewport	= m_texSize;
			tcu::TextureLevel	data		(glu::mapGLTransferFormat(format, dataType), texW, texH, 1);

			tcu::fillWithGrid(data.getAccess(), 8, generateRandomColor(rnd), Vec4(0.0f));

			glGenTextures(1, &tmpTex);
			glBindTexture(GL_TEXTURE_2D, tmpTex);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MIN_FILTER,	GL_LINEAR);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MAG_FILTER,	GL_LINEAR);
			glTexImage2D(GL_TEXTURE_2D, 0, format, texW, texH, 0, format, dataType, data.getAccess().getDataPtr());

			glBindFramebuffer(GL_FRAMEBUFFER, fbo);
			glViewport(0, 0, viewport.x(), viewport.y());
			sglr::drawQuad(*getCurrentContext() , texToFboShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
			checkError();

			// Render to framebuffer
			{
				const Vec3		p0	= Vec3(float(ndx % 2) - 1.0f, float(ndx / 2) - 1.0f, 0.0f);
				const Vec3		p1	= p0 + Vec3(1.0f, 1.0f, 0.0f);

				glBindFramebuffer(GL_FRAMEBUFFER, 0);
				glViewport(0, 0, getWidth(), getHeight());

				glActiveTexture(GL_TEXTURE0);
				glBindTexture(GL_TEXTURE_3D, tex);

				tdTexShader.setDepth(float(layer) / float(m_texSize.z()-1));
				tdTexShader.setUniforms(*getCurrentContext(), tdTexShaderID);

				sglr::drawQuad(*getCurrentContext(), tdTexShaderID, p0, p1);
				checkError();
			}
		}

		readPixels(dst, 0, 0, getWidth(), getHeight());
	}